

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

BufferSp __thiscall
vkt::SpirVAssembly::getSpecializedBuffer<unsigned_int>(SpirVAssembly *this,deInt64 number)

{
  Buffer<unsigned_int> *this_00;
  SharedPtrStateBase *extraout_RDX;
  BufferSp BVar1;
  allocator<unsigned_int> local_35;
  value_type_conflict2 local_34;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  deInt64 local_18;
  deInt64 number_local;
  
  local_18 = number;
  number_local = (deInt64)this;
  this_00 = (Buffer<unsigned_int> *)operator_new(0x20);
  local_34 = (value_type_conflict2)local_18;
  std::allocator<unsigned_int>::allocator(&local_35);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_30,1,&local_34,&local_35);
  Buffer<unsigned_int>::Buffer(this_00,&local_30);
  de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
            ((SharedPtr<vkt::SpirVAssembly::BufferInterface> *)this,(BufferInterface *)this_00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_30);
  std::allocator<unsigned_int>::~allocator(&local_35);
  BVar1.m_state = extraout_RDX;
  BVar1.m_ptr = (BufferInterface *)this;
  return BVar1;
}

Assistant:

BufferSp getSpecializedBuffer (deInt64 number)
{
	return BufferSp(new Buffer<T>(vector<T>(1, (T)number)));
}